

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

idx_t __thiscall
duckdb::RowGroup::Delete
          (RowGroup *this,TransactionData transaction,DataTable *table,row_t *ids,idx_t count)

{
  idx_t i;
  idx_t iVar1;
  VersionDeleteState local_4078;
  
  local_4078.transaction.start_time = transaction.start_time;
  local_4078.transaction.transaction.ptr = transaction.transaction.ptr;
  local_4078.transaction.transaction_id = transaction.transaction_id;
  local_4078.base_row = (this->super_SegmentBase<duckdb::RowGroup>).start;
  local_4078.current_chunk = 0xffffffffffffffff;
  local_4078.count = 0;
  local_4078.delete_count = 0;
  local_4078.info = this;
  local_4078.table = table;
  for (iVar1 = 0; count != iVar1; iVar1 = iVar1 + 1) {
    VersionDeleteState::Delete
              (&local_4078,ids[iVar1] - (this->super_SegmentBase<duckdb::RowGroup>).start);
  }
  VersionDeleteState::Flush(&local_4078);
  return local_4078.delete_count;
}

Assistant:

idx_t RowGroup::Delete(TransactionData transaction, DataTable &table, row_t *ids, idx_t count) {
	VersionDeleteState del_state(*this, transaction, table, this->start);

	// obtain a write lock
	for (idx_t i = 0; i < count; i++) {
		D_ASSERT(ids[i] >= 0);
		D_ASSERT(idx_t(ids[i]) >= this->start && idx_t(ids[i]) < this->start + this->count);
		del_state.Delete(ids[i] - UnsafeNumericCast<row_t>(this->start));
	}
	del_state.Flush();
	return del_state.delete_count;
}